

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tobin.cpp
# Opt level: O3

void exitUsage(char *command)

{
  ostream *poVar1;
  
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<((ostream *)&std::cout,"Converts an integer into binary form.\n");
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<((ostream *)&std::cout,"Usage: ");
  poVar1 = std::operator<<(poVar1,command);
  poVar1 = std::operator<<(poVar1," integer");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<((ostream *)&std::cout,"   integer = [-2147483648..2147483647] \n");
  std::operator<<((ostream *)&std::cout,"             [-0x80000000..0x7fffffff] \n");
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  exit(1);
}

Assistant:

void exitUsage(const char* command) {
		cout << endl;
		cout << "Converts an integer into binary form.\n";
		cout << endl;
		cout << "Usage: " << command << " integer" << endl;
		cout << endl;
		cout << "   integer = [-2147483648..2147483647] \n";
		cout << "             [-0x80000000..0x7fffffff] \n";
		cout << endl;
		exit(1);
}